

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

size_t __thiscall cnn::GaussianNoise::aux_storage_size(GaussianNoise *this)

{
  uint uVar1;
  
  uVar1 = Dim::size((Dim *)this);
  return (ulong)uVar1 << 2;
}

Assistant:

size_t GaussianNoise::aux_storage_size() const {
  return dim.size() * sizeof(float);
}